

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

char * __thiscall Message::DequeueMessage(Message *this)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  pcVar3 = (char *)operator_new__(0x14);
  sem_wait((sem_t *)&this->_empty);
  sem_wait((sem_t *)this);
  iVar1 = this->_current;
  *(undefined4 *)(pcVar3 + 0x10) = *(undefined4 *)(this->_messages[iVar1] + 0x10);
  uVar2 = *(undefined8 *)(this->_messages[iVar1] + 8);
  *(undefined8 *)pcVar3 = *(undefined8 *)this->_messages[iVar1];
  *(undefined8 *)(pcVar3 + 8) = uVar2;
  this->_current = iVar1 + -1;
  sem_post((sem_t *)this);
  sem_post((sem_t *)&this->_full);
  return pcVar3;
}

Assistant:

char* Message::DequeueMessage()
{
    char *msg = new char[MaxMessageSize];
    sem_wait(&_empty);
    sem_wait(&_lock);
    memcpy(msg, &_messages[_current], MaxMessageSize*sizeof(char));
    _current -= 1;
    sem_post(&_lock);
    sem_post(&_full);
    return msg;
}